

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

int mips_vpe_active(CPUMIPSState_conflict8 *env)

{
  uint local_14;
  int active;
  CPUMIPSState_conflict8 *env_local;
  
  local_14 = (uint)((env->mvp->CP0_MVPControl & 1U) != 0);
  if ((env->CP0_VPEConf0 & 1U) == 0) {
    local_14 = 0;
  }
  if (((env->active_tc).CP0_TCStatus & 0x2000U) == 0) {
    local_14 = 0;
  }
  if (((env->active_tc).CP0_TCHalt & 1) != 0) {
    local_14 = 0;
  }
  return local_14;
}

Assistant:

static inline int mips_vpe_active(CPUMIPSState *env)
{
    int active = 1;

    /* Check that the VPE is enabled.  */
    if (!(env->mvp->CP0_MVPControl & (1 << CP0MVPCo_EVP))) {
        active = 0;
    }
    /* Check that the VPE is activated.  */
    if (!(env->CP0_VPEConf0 & (1 << CP0VPEC0_VPA))) {
        active = 0;
    }

    /*
     * Now verify that there are active thread contexts in the VPE.
     *
     * This assumes the CPU model will internally reschedule threads
     * if the active one goes to sleep. If there are no threads available
     * the active one will be in a sleeping state, and we can turn off
     * the entire VPE.
     */
    if (!(env->active_tc.CP0_TCStatus & (1 << CP0TCSt_A))) {
        /* TC is not activated.  */
        active = 0;
    }
    if (env->active_tc.CP0_TCHalt & 1) {
        /* TC is in halt state.  */
        active = 0;
    }

    return active;
}